

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bimap.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
pstore::broker::
bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
::getl(bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
       *this,int *right)

{
  pointer ppVar1;
  pointer ppVar2;
  size_type sVar3;
  size_type sVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_bool>
  pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_58;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  r_a;
  _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *it;
  void *local_30;
  _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_bool>
  emplace_res;
  int *right_local;
  bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
  *this_local;
  
  local_30 = (void *)0x0;
  emplace_res._8_8_ = right;
  pVar5 = std::
          map<int,std::__cxx11::string_const*,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
          ::emplace<int_const&,decltype(nullptr)>
                    ((map<int,std::__cxx11::string_const*,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string_const*>>>
                      *)&this->right_,right,&local_30);
  local_28 = pVar5.first._M_node;
  emplace_res.first._M_node._0_1_ = pVar5.second;
  r_a._8_8_ = &local_28;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                           *)r_a._8_8_);
    if (ppVar1->second != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      assert_failed("it->second == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                    ,0xa0);
    }
    std::__cxx11::string::string((string *)&local_78);
    pVar6 = std::
            map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::emplace<std::__cxx11::string,int_const&>
                      ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)this,&local_78,(int *)emplace_res._8_8_);
    local_58 = pVar6.first._M_node;
    r_a.first._M_node._0_1_ = pVar6.second;
    std::__cxx11::string::~string((string *)&local_78);
    if (((byte)r_a.first._M_node & 1) == 0) {
      assert_failed("r_a.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                    ,0xa2);
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_58);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                           *)r_a._8_8_);
    ppVar1->second = &ppVar2->first;
  }
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::size(&this->left_);
  sVar4 = std::
          map<int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          ::size(&this->right_);
  if (sVar3 == sVar4) {
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                           *)r_a._8_8_);
    return ppVar1->second;
  }
  assert_failed("left_.size () == right_.size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/broker/bimap.hpp"
                ,0xa6);
}

Assistant:

L const & bimap<L, R, Lcmp, Rcmp>::getl (R const & right) {
            auto emplace_res = right_.emplace (right, nullptr);
            auto & it = emplace_res.first;
            if (emplace_res.second) {
                // We inserted a new key-value pair. Update l_ to match.
                PSTORE_ASSERT (it->second == nullptr);
                auto r_a = left_.emplace (L{}, right);
                PSTORE_ASSERT (r_a.second);
                // Point r_.second at the new L instance.
                it->second = &r_a.first->first;
            }
            PSTORE_ASSERT (left_.size () == right_.size ());
            return *it->second;
        }